

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geoplg.cpp
# Opt level: O0

int32 rw::getSizeNativeData(void *object,int32 offset,int32 size)

{
  Geometry *geometry;
  int32 size_local;
  int32 offset_local;
  void *object_local;
  
  if (*(long *)((long)object + 0x98) == 0) {
    object_local._4_4_ = 0;
  }
  else if (**(int **)((long)object + 0x98) == 4) {
    object_local._4_4_ = ps2::getSizeNativeData(object,offset,size);
  }
  else if (**(int **)((long)object + 0x98) == 0xb) {
    object_local._4_4_ = wdgl::getSizeNativeData(object,offset,size);
  }
  else if (**(int **)((long)object + 0x98) == 5) {
    object_local._4_4_ = xbox::getSizeNativeData(object,offset,size);
  }
  else if (**(int **)((long)object + 0x98) == 8) {
    object_local._4_4_ = d3d8::getSizeNativeData(object,offset,size);
  }
  else if (**(int **)((long)object + 0x98) == 9) {
    object_local._4_4_ = d3d9::getSizeNativeData(object,offset,size);
  }
  else {
    object_local._4_4_ = 0;
  }
  return object_local._4_4_;
}

Assistant:

static int32
getSizeNativeData(void *object, int32 offset, int32 size)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil)
		return 0;
	if(geometry->instData->platform == PLATFORM_PS2)
		return ps2::getSizeNativeData(object, offset, size);
	else if(geometry->instData->platform == PLATFORM_WDGL)
		return wdgl::getSizeNativeData(object, offset, size);
	else if(geometry->instData->platform == PLATFORM_XBOX)
		return xbox::getSizeNativeData(object, offset, size);
	else if(geometry->instData->platform == PLATFORM_D3D8)
		return d3d8::getSizeNativeData(object, offset, size);
	else if(geometry->instData->platform == PLATFORM_D3D9)
		return d3d9::getSizeNativeData(object, offset, size);
	return 0;
}